

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O2

void readInt(void)

{
  fwrite("Readint:\n",9,1,(FILE *)ofp);
  fwrite("         xor       cx, cx\n",0x1a,1,(FILE *)ofp);
  fwrite("         mov       bx, 10\n",0x1a,1,(FILE *)ofp);
  fwrite("Re1:\n",5,1,(FILE *)ofp);
  fwrite("         mov       ah, 01h\n",0x1b,1,(FILE *)ofp);
  fwrite("         int       21h\n",0x17,1,(FILE *)ofp);
  fwrite("         cmp       al, 13\n",0x1a,1,(FILE *)ofp);
  fwrite("         jz        Re2\n",0x17,1,(FILE *)ofp);
  fwrite("         and       ax, 0fh\n",0x1b,1,(FILE *)ofp);
  fwrite("         xchg      ax, cx\n",0x1a,1,(FILE *)ofp);
  fwrite("         mul       bx\n",0x16,1,(FILE *)ofp);
  fwrite("         add       ax, cx\n",0x1a,1,(FILE *)ofp);
  fwrite("         xchg      ax, cx\n",0x1a,1,(FILE *)ofp);
  fwrite("         jmp       Re1\n",0x17,1,(FILE *)ofp);
  fwrite("Re2:\n",5,1,(FILE *)ofp);
  fwrite("         ret\n",0xd,1,(FILE *)ofp);
  return;
}

Assistant:

void     readInt()
{
    fprintf(ofp, "Readint:\n");
    fprintf(ofp, "         xor       cx, cx\n");
    fprintf(ofp, "         mov       bx, 10\n");
    fprintf(ofp, "Re1:\n");
    fprintf(ofp, "         mov       ah, 01h\n");
    fprintf(ofp, "         int       21h\n");
    fprintf(ofp, "         cmp       al, 13\n");
    fprintf(ofp, "         jz        Re2\n");
    
    fprintf(ofp, "         and       ax, 0fh\n");
    fprintf(ofp, "         xchg      ax, cx\n");
    fprintf(ofp, "         mul       bx\n");
    fprintf(ofp, "         add       ax, cx\n");
    fprintf(ofp, "         xchg      ax, cx\n");
    fprintf(ofp, "         jmp       Re1\n");
    
    fprintf(ofp, "Re2:\n");
    fprintf(ofp, "         ret\n");
}